

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

SQInstance * SQInstance::Create(SQSharedState *ss,SQClass *theclass)

{
  SQInstance *this;
  SQUnsignedInteger SVar1;
  long lVar2;
  
  SVar1 = (theclass->_defaultvalues)._size;
  lVar2 = 0x68;
  if (SVar1 != 0) {
    lVar2 = SVar1 * 0x10 + 0x58;
  }
  SVar1 = lVar2 + theclass->_udsize;
  this = (SQInstance *)sq_vm_malloc(SVar1);
  SQInstance(this,ss,theclass,SVar1);
  if (theclass->_udsize != 0) {
    this->_userpointer = (SQUserPointer)((long)this + (SVar1 - theclass->_udsize));
  }
  return this;
}

Assistant:

static SQInstance* Create(SQSharedState *ss,SQClass *theclass) {

        SQInteger size = calcinstancesize(theclass);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, theclass,size);
        if(theclass->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - theclass->_udsize);
        }
        return newinst;
    }